

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O1

BasicImageIO * __thiscall gimage::ImageIO::getBasicImageIO(ImageIO *this,char *name,bool reading)

{
  char cVar1;
  int iVar2;
  BasicImageIO *in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IOException *this_00;
  long *plVar3;
  size_type *psVar4;
  pointer ppBVar5;
  bool bVar6;
  allocator local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ppBVar5 = (this->list).
            super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar6 = ppBVar5 < (this->list).
                    super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar6) {
    iVar2 = (*(*ppBVar5)->_vptr_BasicImageIO[3])(*ppBVar5,name,(ulong)reading);
    in_RAX = (BasicImageIO *)CONCAT44(extraout_var,iVar2);
    cVar1 = (char)iVar2;
    while (cVar1 == '\0') {
      ppBVar5 = ppBVar5 + 1;
      bVar6 = ppBVar5 < (this->list).
                        super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar6) goto LAB_00133ea0;
      iVar2 = (*(*ppBVar5)->_vptr_BasicImageIO[3])(*ppBVar5,name,(ulong)reading);
      in_RAX = (BasicImageIO *)CONCAT44(extraout_var_00,iVar2);
      cVar1 = (char)iVar2;
    }
    in_RAX = *ppBVar5;
  }
LAB_00133ea0:
  if (bVar6) {
    return in_RAX;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_68,name,&local_89);
  std::operator+(&local_48,"Unknown image type (",&local_68);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_88._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_88._M_dataplus._M_p == psVar4) {
    local_88.field_2._M_allocated_capacity = *psVar4;
    local_88.field_2._8_8_ = plVar3[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar4;
  }
  local_88._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  gutil::IOException::IOException(this_00,&local_88);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

const BasicImageIO &ImageIO::getBasicImageIO(const char *name, bool reading) const
{
  for (std::vector<BasicImageIO *>::const_iterator it=list.begin(); it<list.end(); ++it)
  {
    if ((*it)->handlesFile(name, reading))
    {
      return **it;
    }
  }

  throw gutil::IOException("Unknown image type ("+std::string(name)+")");
}